

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_GetFloorTerrain
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *__assertion;
  AActor *thing;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0043300b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    thing = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (thing != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043300b;
        }
        goto LAB_00432fc4;
      }
    }
    else if (thing != (AActor *)0x0) goto LAB_00432ffb;
    thing = (AActor *)0x0;
LAB_00432fc4:
    iVar2 = P_GetThingFloorType(thing);
    if (numret < 1) {
      iVar2 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1781,
                      "int AF_AActor_GetFloorTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetPointer(ret,Terrains.Array + iVar2,0);
      iVar2 = 1;
    }
    return iVar2;
  }
LAB_00432ffb:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0043300b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1780,
                "int AF_AActor_GetFloorTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetFloorTerrain)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_POINTER(&Terrains[P_GetThingFloorType(self)]);
}